

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger_lib.cpp
# Opt level: O0

int tcpSharedListen(lua_State *L)

{
  dll_lua_pushstring p_Var1;
  undefined8 uVar2;
  bool bVar3;
  EmmyFacade *this;
  char *pcVar4;
  allocator local_81;
  string local_80;
  byte local_59;
  int iStack_58;
  bool suc;
  lua_Integer port;
  char *local_40;
  char *host;
  string err;
  lua_State *L_local;
  
  err.field_2._8_8_ = L;
  (*luaL_checklstring)(L,1,(size_t *)0x0);
  std::__cxx11::string::string((string *)&host);
  local_40 = (*lua_tolstring)((lua_State *)err.field_2._8_8_,1,(size_t *)0x0);
  (*luaL_checknumber)((lua_State *)err.field_2._8_8_,2);
  _iStack_58 = lua_tointeger((lua_State *)err.field_2._8_8_,2);
  this = EmmyFacade::Get();
  uVar2 = err.field_2._8_8_;
  pcVar4 = local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_80,pcVar4,&local_81);
  bVar3 = EmmyFacade::TcpSharedListen(this,(lua_State *)uVar2,&local_80,iStack_58,(string *)&host);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  local_59 = bVar3;
  (*lua_pushboolean)((lua_State *)err.field_2._8_8_,(uint)bVar3);
  uVar2 = err.field_2._8_8_;
  p_Var1 = lua_pushstring;
  if ((local_59 & 1) == 0) {
    pcVar4 = (char *)std::__cxx11::string::c_str();
    (*p_Var1)((lua_State *)uVar2,pcVar4);
    L_local._4_4_ = 2;
  }
  else {
    L_local._4_4_ = 1;
  }
  std::__cxx11::string::~string((string *)&host);
  return L_local._4_4_;
}

Assistant:

int tcpSharedListen(lua_State* L)
{
	luaL_checkstring(L, 1);
	std::string err;
	const auto host = lua_tostring(L, 1);
	luaL_checknumber(L, 2);
	const auto port = lua_tointeger(L, 2);
	const auto suc = EmmyFacade::Get().TcpSharedListen(L, host, static_cast<int>(port), err);
	lua_pushboolean(L, suc);
	if (suc) return 1;
	lua_pushstring(L, err.c_str());
	return 2;
}